

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O0

void __thiscall CNetAddr::SerializeV1Array(CNetAddr *this,uint8_t (*arr) [16])

{
  long lVar1;
  size_type sVar2;
  const_pointer __src;
  const_pointer __src_00;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *this_00;
  value_type_conflict3 *pvVar3;
  void *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  size_t prefix_size;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff78;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  switch(*(undefined4 *)(in_RDI + 0x18)) {
  case 0:
  case 7:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.h"
                  ,0x15f,"void CNetAddr::SerializeV1Array(uint8_t (&)[16]) const");
  case 1:
    sVar2 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size(in_stack_ffffffffffffff88);
    if (sVar2 != 4) {
      __assert_fail("prefix_size + m_addr.size() == sizeof(arr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.h"
                    ,0x14f,"void CNetAddr::SerializeV1Array(uint8_t (&)[16]) const");
    }
    __src = std::array<unsigned_char,_12UL>::data
                      ((array<unsigned_char,_12UL> *)in_stack_ffffffffffffff78);
    memcpy(in_RSI,__src,0xc);
    pvVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::data(in_stack_ffffffffffffff78);
    sVar2 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size(in_stack_ffffffffffffff88);
    memcpy((void *)((long)in_RSI + 0xc),pvVar3,(ulong)sVar2);
    break;
  case 2:
    sVar2 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size(in_stack_ffffffffffffff88);
    if (sVar2 != 0x10) {
      __assert_fail("m_addr.size() == sizeof(arr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.h"
                    ,0x14a,"void CNetAddr::SerializeV1Array(uint8_t (&)[16]) const");
    }
    pvVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::data(in_stack_ffffffffffffff78);
    sVar2 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size(in_stack_ffffffffffffff88);
    memcpy(in_RSI,pvVar3,(ulong)sVar2);
    break;
  case 3:
  case 4:
  case 5:
  default:
    memset(in_RSI,0,0x10);
    break;
  case 6:
    sVar2 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size(in_stack_ffffffffffffff88);
    if (sVar2 != 10) {
      __assert_fail("prefix_size + m_addr.size() == sizeof(arr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.h"
                    ,0x155,"void CNetAddr::SerializeV1Array(uint8_t (&)[16]) const");
    }
    __src_00 = std::array<unsigned_char,_6UL>::data
                         ((array<unsigned_char,_6UL> *)in_stack_ffffffffffffff78);
    memcpy(in_RSI,__src_00,6);
    this_00 = (prevector<16U,_unsigned_char,_unsigned_int,_int> *)((long)in_RSI + 6);
    pvVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::data(in_stack_ffffffffffffff78);
    sVar2 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size(this_00);
    memcpy(this_00,pvVar3,(ulong)sVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SerializeV1Array(uint8_t (&arr)[V1_SERIALIZATION_SIZE]) const
    {
        size_t prefix_size;

        switch (m_net) {
        case NET_IPV6:
            assert(m_addr.size() == sizeof(arr));
            memcpy(arr, m_addr.data(), m_addr.size());
            return;
        case NET_IPV4:
            prefix_size = sizeof(IPV4_IN_IPV6_PREFIX);
            assert(prefix_size + m_addr.size() == sizeof(arr));
            memcpy(arr, IPV4_IN_IPV6_PREFIX.data(), prefix_size);
            memcpy(arr + prefix_size, m_addr.data(), m_addr.size());
            return;
        case NET_INTERNAL:
            prefix_size = sizeof(INTERNAL_IN_IPV6_PREFIX);
            assert(prefix_size + m_addr.size() == sizeof(arr));
            memcpy(arr, INTERNAL_IN_IPV6_PREFIX.data(), prefix_size);
            memcpy(arr + prefix_size, m_addr.data(), m_addr.size());
            return;
        case NET_ONION:
        case NET_I2P:
        case NET_CJDNS:
            break;
        case NET_UNROUTABLE:
        case NET_MAX:
            assert(false);
        } // no default case, so the compiler can warn about missing cases

        // Serialize ONION, I2P and CJDNS as all-zeros.
        memset(arr, 0x0, V1_SERIALIZATION_SIZE);
    }